

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::shader_io_blocks
               (NegativeTestContext *ctx)

{
  NegativeTestContext *ctx_00;
  string local_1e0;
  ostringstream local_1c0 [8];
  ostringstream source;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_EXT_shader_io_blocks features require enabling the extension in 310 es shaders.",
             &local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  std::operator<<((ostream *)local_1c0,
                  "#version 310 es\nin Data\n{\n\tmediump vec3 a;\n} data;\nvoid main()\n{\n}\n");
  ctx_00 = local_10;
  std::__cxx11::ostringstream::str();
  verifyShader(ctx_00,SHADERTYPE_FRAGMENT,&local_1e0,EXPECT_RESULT_FAIL);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_1c0);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void shader_io_blocks (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_EXT_shader_io_blocks features require enabling the extension in 310 es shaders.");
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"in Data\n"
					"{\n"
					"	mediump vec3 a;\n"
					"} data;\n"
					"void main()\n"
					"{\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
}